

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar1;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  int iVar4;
  ImU32 fill_col;
  ImGuiDataTypeInfo *pIVar5;
  uint uVar6;
  byte bVar7;
  ImGuiCol idx;
  byte bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  char *local_f0;
  ImRect frame_bb;
  ImVec2 local_90;
  ImRect total_bb;
  char value_buf [64];
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  fVar10 = CalcItemWidth();
  IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar11 = IVar1.x;
  text_baseline_y = (pIVar2->Style).FramePadding.y;
  frame_bb.Min.x = (this->DC).CursorPos.x;
  frame_bb.Min.y = (this->DC).CursorPos.y;
  frame_bb.Max.x = fVar10 + frame_bb.Min.x;
  frame_bb.Max.y = text_baseline_y + text_baseline_y + IVar1.y + frame_bb.Min.y;
  fVar10 = 0.0;
  if (0.0 < fVar11) {
    fVar10 = (pIVar2->Style).ItemInnerSpacing.x + fVar11;
  }
  total_bb.Max.x = fVar10 + frame_bb.Max.x;
  total_bb.Max.y = frame_bb.Max.y + 0.0;
  uVar6 = flags & 0x80;
  total_bb.Min.x = frame_bb.Min.x;
  total_bb.Min.y = frame_bb.Min.y;
  ItemSize(&total_bb,text_baseline_y);
  bVar3 = ItemAdd(&total_bb,id,&frame_bb,uVar6 * 2 ^ 0x100);
  if (!bVar3) {
    return false;
  }
  if (format == (char *)0x0) {
    pIVar5 = DataTypeGetInfo(data_type);
    local_f0 = pIVar5->PrintFmt;
  }
  else {
    local_f0 = format;
    if ((data_type == 4) && (((*format != '%' || (format[1] != 'd')) || (format[2] != '\0')))) {
      local_f0 = PatchFormatStringFloatToInt(format);
    }
  }
  bVar3 = ItemHoverable(&frame_bb,id);
  if (uVar6 == 0) {
    if ((GImGui->ActiveId == id) && (GImGui->TempInputId == id)) goto LAB_0016678e;
    bVar8 = *(byte *)((long)&(pIVar2->LastItemData).StatusFlags + 1) & 1;
  }
  else {
    bVar8 = 0;
  }
  if (bVar3) {
    bVar7 = (pIVar2->IO).MouseClicked[0];
    bVar9 = (pIVar2->IO).MouseClickedCount[0] == 2;
  }
  else {
    bVar7 = 0;
    bVar9 = false;
  }
  if ((((bVar8 != 0 || (bVar7 & 1) != 0) || bVar9) || (pIVar2->NavActivateId == id)) ||
     (pIVar2->NavActivateInputId == id)) {
    SetActiveID(id,this);
    SetFocusID(id,this);
    FocusWindow(this);
    pIVar2->ActiveIdUsingNavDirMask = 3;
    if (uVar6 != 0) goto LAB_00166891;
    if (bVar8 != 0) goto LAB_0016678e;
    if (bVar7 == 0) {
      if (bVar9) goto LAB_0016678e;
    }
    else if (bVar9 || ((pIVar2->IO).KeyCtrl & 1U) != 0) goto LAB_0016678e;
    if (pIVar2->NavActivateInputId == id) goto LAB_0016678e;
  }
  if ((((uVar6 == 0) && ((pIVar2->IO).ConfigDragClickToInputText != false)) &&
      (bVar3 && pIVar2->ActiveId == id)) &&
     (((pIVar2->IO).MouseReleased[0] == true &&
      (bVar9 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar9)))) {
    pIVar2->NavActivateInputId = id;
    pIVar2->NavActivateId = id;
    pIVar2->NavActivateFlags = 1;
LAB_0016678e:
    if ((flags & 0x10U) == 0) {
      p_max = (void *)0x0;
      p_min = (void *)0x0;
    }
    else if (p_max != (void *)0x0 && p_min != (void *)0x0) {
      iVar4 = DataTypeCompare(data_type,p_min,p_max);
      if (-1 < iVar4) {
        p_max = (void *)0x0;
        p_min = (void *)0x0;
      }
    }
    bVar3 = TempInputScalar(&frame_bb,id,label,data_type,p_data,local_f0,p_min,p_max);
    return bVar3;
  }
LAB_00166891:
  idx = 9;
  if (pIVar2->ActiveId != id) {
    idx = bVar3 + 7;
  }
  fill_col = GetColorU32(idx,1.0);
  RenderNavHighlight(&frame_bb,id,1);
  IVar1.y = frame_bb.Min.y;
  IVar1.x = frame_bb.Min.x;
  p_max_00.y = frame_bb.Max.y;
  p_max_00.x = frame_bb.Max.x;
  RenderFrame(IVar1,p_max_00,fill_col,true,(pIVar2->Style).FrameRounding);
  bVar3 = DragBehavior(id,data_type,p_data,v_speed,p_min,p_max,local_f0,flags);
  if (bVar3) {
    MarkItemEdited(id);
  }
  iVar4 = DataTypeFormatString(value_buf,0x40,data_type,p_data,local_f0);
  if (pIVar2->LogEnabled == true) {
    LogSetNextTextDecoration("{","}");
  }
  local_90.x = 0.5;
  local_90.y = 0.5;
  RenderTextClipped(&frame_bb.Min,&frame_bb.Max,value_buf,value_buf + iVar4,(ImVec2 *)0x0,&local_90,
                    (ImRect *)0x0);
  if (0.0 < fVar11) {
    pos.y = (pIVar2->Style).FramePadding.y + frame_bb.Min.y;
    pos.x = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    RenderText(pos,label,(char *)0x0,true);
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}